

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O3

ssize_t __thiscall
icu_63::number::impl::NumberStringBuilder::splice
          (NumberStringBuilder *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
          size_t __len,uint __flags)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  long lVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  uint count;
  undefined4 in_register_00000034;
  long lVar6;
  ulong uVar7;
  ValueOrHeapArray<char16_t> *pVVar8;
  ValueOrHeapArray<UNumberFormatFields> *pVVar9;
  char16_t cVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  UErrorCode *in_stack_00000010;
  
  lVar5 = CONCAT44(in_register_0000000c,__fdout);
  uVar12 = (int)__len - (int)__offout;
  count = (__fdin - (int)__offin) + uVar12;
  if ((int)count < 1) {
    iVar3 = remove(this,(char *)CONCAT44(in_register_00000034,__fdin));
  }
  else {
    iVar3 = prepareForInsert(this,__fdin,count,in_stack_00000010);
  }
  if (0 < (int)uVar12 && *in_stack_00000010 < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar1 = this->fUsingHeap;
    lVar6 = (long)(int)__offout;
    lVar4 = (long)iVar3;
    uVar7 = (ulong)uVar12;
    do {
      sVar2 = *(short *)(lVar5 + 8);
      if (sVar2 < 0) {
        uVar12 = *(uint *)(lVar5 + 0xc);
      }
      else {
        uVar12 = (int)sVar2 >> 5;
      }
      cVar10 = L'\xffff';
      if ((uint)lVar6 < uVar12) {
        lVar11 = lVar5 + 10;
        if (((int)sVar2 & 2U) == 0) {
          lVar11 = *(long *)(lVar5 + 0x18);
        }
        cVar10 = *(char16_t *)(lVar11 + lVar6 * 2);
      }
      bVar13 = bVar1 == false;
      pVVar8 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      if (bVar13) {
        pVVar8 = &this->fChars;
      }
      pVVar8->value[lVar4] = cVar10;
      pVVar9 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      if (bVar13) {
        pVVar9 = &this->fFields;
      }
      pVVar9->value[lVar4] = __flags;
      lVar4 = lVar4 + 1;
      lVar6 = lVar6 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  return (ulong)count;
}

Assistant:

int32_t
NumberStringBuilder::splice(int32_t startThis, int32_t endThis,  const UnicodeString &unistr,
                            int32_t startOther, int32_t endOther, Field field, UErrorCode& status) {
    int32_t thisLength = endThis - startThis;
    int32_t otherLength = endOther - startOther;
    int32_t count = otherLength - thisLength;
    int32_t position;
    if (count > 0) {
        // Overall, chars need to be added.
        position = prepareForInsert(startThis, count, status);
    } else {
        // Overall, chars need to be removed or kept the same.
        position = remove(startThis, -count);
    }
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < otherLength; i++) {
        getCharPtr()[position + i] = unistr.charAt(startOther + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}